

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# special_functions.hpp
# Opt level: O3

float trng::math::detail::inv_erfc<float>(float x)

{
  uint uVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  
  uVar1 = -(uint)(1.0 < x);
  fVar5 = (float)(~uVar1 & (uint)x | (uint)(1.0 - (x + -1.0)) & uVar1);
  fVar2 = inv_Phi_approx<float>(fVar5 * 0.5);
  fVar2 = fVar2 * -0.70710677;
  if ((uint)ABS(fVar2) < 0x7f800000) {
    fVar3 = erfcf(fVar2);
    fVar4 = expf(fVar2 * fVar2);
    fVar4 = fVar4 * (fVar3 - fVar5) * -0.88622695;
    fVar2 = fVar2 - fVar4 / (fVar2 * fVar4 + 1.0);
  }
  return (float)(~uVar1 & (uint)fVar2 | (uint)-fVar2 & uVar1);
}

Assistant:

TRNG_CUDA_ENABLE T inv_erfc(T x) {
        // step size in the Halley step is proportional to erfc, use symmetry to increase
        // numerical accuracy
        const bool flag{x > 1};
        if (flag)
          x = -(x - 1) + 1;
        T y{-inv_Phi_approx(x / 2) * constants<T>::one_over_sqrt_2};
        // refinement by Halley rational method
        if (isfinite(y)) {
          const T e{erfc(y) - x};
          const T u{-e * (constants<T>::sqrt_pi_over_2) * exp(y * y)};
          y -= u / (1 + y * u);
        }
        // T is a floating point number type with more than 80 bits, a 2nd iteration is
        // required to reach full machine precision
#if __cplusplus >= 201703L
        if constexpr (sizeof(T) > 10) {
#else
#if _MSC_VER
#pragma warning(push)
#pragma warning(disable : 4127)
#endif
        if (sizeof(T) > 10) {
#if _MSC_VER
#pragma warning(pop)
#endif
#endif
          if (isfinite(y)) {
            const T e{erfc(y) - x};
            const T u{-e * (constants<T>::sqrt_pi_over_2) * exp(y * y)};
            y -= u / (1 + y * u);
          }
        }
        return flag ? -y : y;
      }

    }